

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O1

Status __thiscall spvtools::opt::ConvertToSampledImagePass::Process(ConvertToSampledImagePass *this)

{
  __node_base _Var1;
  bool bVar2;
  Status SVar3;
  Status SVar4;
  Status SVar5;
  iterator iVar6;
  DescriptorSetBindingToInstruction *__range2;
  DescriptorSetBindingToInstruction descriptor_set_binding_pair_to_image;
  DescriptorSetBindingToInstruction descriptor_set_binding_pair_to_sampler;
  _Hashtable<spvtools::opt::DescriptorSetAndBinding,_std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::DescriptorSetAndBinding>,_spvtools::opt::ConvertToSampledImagePass::DescriptorSetAndBindingHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_98;
  _Hashtable<spvtools::opt::DescriptorSetAndBinding,_std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::DescriptorSetAndBinding>,_spvtools::opt::ConvertToSampledImagePass::DescriptorSetAndBindingHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_60;
  
  local_60._M_buckets = &local_60._M_single_bucket;
  local_60._M_bucket_count = 1;
  local_60._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_60._M_element_count = 0;
  local_60._M_rehash_policy._M_max_load_factor = 1.0;
  local_60._M_rehash_policy._M_next_resize = 0;
  local_60._M_single_bucket = (__node_base_ptr)0x0;
  local_98._M_buckets = &local_98._M_single_bucket;
  local_98._M_bucket_count = 1;
  local_98._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_98._M_element_count = 0;
  local_98._M_rehash_policy._M_max_load_factor = 1.0;
  local_98._M_rehash_policy._M_next_resize = 0;
  local_98._M_single_bucket = (__node_base_ptr)0x0;
  bVar2 = CollectResourcesToConvert
                    (this,(DescriptorSetBindingToInstruction *)&local_60,
                     (DescriptorSetBindingToInstruction *)&local_98);
  _Var1._M_nxt = local_98._M_before_begin._M_nxt;
  SVar5 = Failure;
  if (bVar2) {
    bVar2 = local_98._M_before_begin._M_nxt == (_Hash_node_base *)0x0;
    if (bVar2) {
      SVar3 = SuccessWithoutChange;
    }
    else {
      SVar3 = UpdateImageVariableToSampledImage
                        (this,(Instruction *)local_98._M_before_begin._M_nxt[2]._M_nxt,
                         (DescriptorSetAndBinding *)(local_98._M_before_begin._M_nxt + 1));
      while (SVar3 != Failure) {
        _Var1._M_nxt = (_Var1._M_nxt)->_M_nxt;
        bVar2 = _Var1._M_nxt == (_Hash_node_base *)0x0;
        if (bVar2) break;
        SVar4 = UpdateImageVariableToSampledImage
                          (this,(Instruction *)_Var1._M_nxt[2]._M_nxt,
                           (DescriptorSetAndBinding *)(_Var1._M_nxt + 1));
        if ((int)SVar4 < (int)SVar3) {
          SVar3 = SVar4;
        }
      }
    }
    _Var1._M_nxt = local_60._M_before_begin._M_nxt;
    if (bVar2) {
      for (; SVar5 = SVar3, _Var1._M_nxt != (_Hash_node_base *)0x0;
          _Var1._M_nxt = (_Var1._M_nxt)->_M_nxt) {
        iVar6 = std::
                _Hashtable<spvtools::opt::DescriptorSetAndBinding,_std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::DescriptorSetAndBinding>,_spvtools::opt::ConvertToSampledImagePass::DescriptorSetAndBindingHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&local_98,(key_type *)(_Var1._M_nxt + 1));
        if ((iVar6.
             super__Node_iterator_base<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_true>
             ._M_cur == (__node_type *)0x0) ||
           (*(Instruction **)
             ((long)iVar6.
                    super__Node_iterator_base<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_true>
                    ._M_cur + 0x10) == (Instruction *)0x0)) {
          bVar2 = false;
        }
        else {
          SVar5 = CheckUsesOfSamplerVariable
                            (this,(Instruction *)_Var1._M_nxt[2]._M_nxt,
                             *(Instruction **)
                              ((long)iVar6.
                                     super__Node_iterator_base<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_true>
                                     ._M_cur + 0x10));
          if ((int)SVar5 < (int)SVar3) {
            SVar3 = SVar5;
          }
          bVar2 = SVar3 != Failure;
        }
        SVar5 = Failure;
        if (!bVar2) break;
      }
    }
  }
  std::
  _Hashtable<spvtools::opt::DescriptorSetAndBinding,_std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::DescriptorSetAndBinding>,_spvtools::opt::ConvertToSampledImagePass::DescriptorSetAndBindingHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_98);
  std::
  _Hashtable<spvtools::opt::DescriptorSetAndBinding,_std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::DescriptorSetAndBinding>,_spvtools::opt::ConvertToSampledImagePass::DescriptorSetAndBindingHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_60);
  return SVar5;
}

Assistant:

Pass::Status ConvertToSampledImagePass::Process() {
  Status status = Status::SuccessWithoutChange;

  DescriptorSetBindingToInstruction descriptor_set_binding_pair_to_sampler,
      descriptor_set_binding_pair_to_image;
  if (!CollectResourcesToConvert(&descriptor_set_binding_pair_to_sampler,
                                 &descriptor_set_binding_pair_to_image)) {
    return Status::Failure;
  }

  for (auto& image : descriptor_set_binding_pair_to_image) {
    status = CombineStatus(
        status, UpdateImageVariableToSampledImage(image.second, image.first));
    if (status == Status::Failure) {
      return status;
    }
  }

  for (const auto& sampler : descriptor_set_binding_pair_to_sampler) {
    // Converting only a Sampler to Sampled Image is not allowed. It must have a
    // corresponding image to combine the sampler with.
    auto image_itr = descriptor_set_binding_pair_to_image.find(sampler.first);
    if (image_itr == descriptor_set_binding_pair_to_image.end() ||
        image_itr->second == nullptr) {
      return Status::Failure;
    }

    status = CombineStatus(
        status, CheckUsesOfSamplerVariable(sampler.second, image_itr->second));
    if (status == Status::Failure) {
      return status;
    }
  }

  return status;
}